

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONParser.cpp
# Opt level: O0

Var __thiscall JSON::JSONParser::ParseObject(JSONParser *this)

{
  JsonTypeCacheList *this_00;
  PropertyRecord *this_01;
  ScriptContext *scriptContext;
  JsonTypeCache *pJVar1;
  bool bVar2;
  PropertyIndex propertyIndex_00;
  tokens tVar3;
  int newCount;
  PropertyId PVar4;
  int iVar5;
  ThreadContext *this_02;
  char16 *content;
  JavascriptLibrary *pJVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_03;
  RecyclableObject *obj;
  JsonTypeCache **ppJVar8;
  DynamicType *this_04;
  DynamicTypeHandler *pDVar9;
  ulong uVar10;
  double dVar11;
  bool local_171;
  PropertyIndex propertyIndex_1;
  DynamicType *typeWithProperty;
  PropertyValueInfo info;
  Var value_1;
  PropertyRecord *propertyRecord;
  Var value_2;
  PropertyIndex propertyIndex;
  DynamicType *pDStack_d8;
  PropertyId propertyId;
  DynamicType *typeWithProperty_1;
  JsonTypeCache *local_c0;
  HashedCharacterBuffer<char16_t> local_b8;
  DynamicType *local_a8;
  DynamicType *typeWithoutProperty;
  char16 *pcStack_98;
  uint currentStrLength;
  WCHAR *currentStr;
  JsonTypeCache *currentCache;
  JsonTypeCache *previousCache;
  DynamicObject *object;
  undefined8 local_70;
  TrackAllocData local_68;
  Var local_40;
  Var value;
  JSONParser *pJStack_30;
  uint k;
  JavascriptArray *arrayObj;
  JSONParser *pJStack_20;
  uint len;
  Var retVal;
  JSONParser *this_local;
  
  retVal = this;
  this_02 = Js::ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::ProbeStack(this_02,0xc00,this->scriptContext,(PVOID)0x0);
  tVar3 = (this->m_token).tk;
  if (tVar3 == tkFALSE) {
    pJVar6 = Js::ScriptContext::GetLibrary(this->scriptContext);
    pJStack_20 = (JSONParser *)
                 Js::JavascriptLibraryBase::GetFalse(&pJVar6->super_JavascriptLibraryBase);
    Scan(this);
    this_local = pJStack_20;
  }
  else if (tVar3 == tkNULL) {
    pJVar6 = Js::ScriptContext::GetLibrary(this->scriptContext);
    pJStack_20 = (JSONParser *)
                 Js::JavascriptLibraryBase::GetNull(&pJVar6->super_JavascriptLibraryBase);
    Scan(this);
    this_local = pJStack_20;
  }
  else if (tVar3 == tkTRUE) {
    pJVar6 = Js::ScriptContext::GetLibrary(this->scriptContext);
    pJStack_20 = (JSONParser *)
                 Js::JavascriptLibraryBase::GetTrue(&pJVar6->super_JavascriptLibraryBase);
    Scan(this);
    this_local = pJStack_20;
  }
  else if (tVar3 == tkLCurly) {
    bVar2 = IsCaching(this);
    if ((bVar2) && (this->typeCacheList == (JsonTypeCacheList *)0x0)) {
      pAVar7 = &this->arenaAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_68,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONParser.cpp"
                 ,0x11f);
      pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar7,&local_68);
      object = (DynamicObject *)Memory::ArenaAllocator::Alloc;
      local_70 = 0;
      this_03 = (BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar7,0x3f67b0);
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_03,this->arenaAllocator,8);
      this->typeCacheList = this_03;
    }
    pJVar6 = Js::ScriptContext::GetLibrary(this->scriptContext);
    previousCache = (JsonTypeCache *)Js::JavascriptLibrary::CreateObject(pJVar6,false,0);
    bVar2 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,autoProxyFlag);
    if (bVar2) {
      obj = Js::JavascriptProxy::AutoProxyWrapper(previousCache);
      previousCache = (JsonTypeCache *)Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    }
    Scan(this);
    if ((this->m_token).tk != tkRCurly) {
      currentCache = (JsonTypeCache *)0x0;
      currentStr = (WCHAR *)0x0;
      do {
        while( true ) {
          if ((this->m_token).tk != tkStrCon) {
            JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9e9);
          }
          pcStack_98 = JSONScanner::GetCurrentString(&this->m_scanner);
          typeWithoutProperty._4_4_ = JSONScanner::GetCurrentStringLen(&this->m_scanner);
          local_a8 = Js::DynamicObject::GetDynamicType((DynamicObject *)previousCache);
          bVar2 = IsCaching(this);
          if (bVar2) break;
LAB_010b1cbf:
          Js::ScriptContext::GetOrAddPropertyRecord
                    (this->scriptContext,pcStack_98,typeWithoutProperty._4_4_,
                     (PropertyRecord **)&value_1);
          tVar3 = Scan(this);
          if (tVar3 != tkColon) {
            JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ed);
          }
          Scan(this);
          info._56_8_ = ParseObject(this);
          Js::PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&typeWithProperty);
          pJVar1 = previousCache;
          PVar4 = Js::PropertyRecord::GetPropertyId((PropertyRecord *)value_1);
          (**(code **)&pJVar1->propertyRecord[7].isNumeric)
                    (pJVar1,PVar4,info._56_8_,0,&typeWithProperty);
          this_04 = Js::DynamicObject::GetDynamicType((DynamicObject *)previousCache);
          bVar2 = IsCaching(this);
          if ((((bVar2) &&
               (bVar2 = Js::PropertyRecord::IsNumeric((PropertyRecord *)value_1), !bVar2)) &&
              (bVar2 = Js::PropertyValueInfo::IsNoCache((PropertyValueInfo *)&typeWithProperty),
              !bVar2)) && (bVar2 = Js::DynamicType::GetIsShared(this_04), bVar2)) {
            pDVar9 = Js::DynamicType::GetTypeHandler(this_04);
            iVar5 = (*pDVar9->_vptr_DynamicTypeHandler[0x4e])();
            if (iVar5 != 0) {
              propertyIndex_00 =
                   Js::PropertyValueInfo::GetPropertyIndex((PropertyValueInfo *)&typeWithProperty);
              if (currentCache == (JsonTypeCache *)0x0) {
                currentStr = (WCHAR *)JsonTypeCache::New(this->arenaAllocator,
                                                         (PropertyRecord *)value_1,local_a8,this_04,
                                                         propertyIndex_00);
                JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::AddNew(this->typeCacheList,(PropertyRecord **)&value_1,
                         (JsonTypeCache **)&currentStr);
              }
              else if (currentStr == (WCHAR *)0x0) {
                currentStr = (WCHAR *)JsonTypeCache::New(this->arenaAllocator,
                                                         (PropertyRecord *)value_1,local_a8,this_04,
                                                         propertyIndex_00);
                currentCache->next = (JsonTypeCache *)currentStr;
              }
              else {
                JsonTypeCache::Update
                          ((JsonTypeCache *)currentStr,(PropertyRecord *)value_1,local_a8,this_04,
                           propertyIndex_00);
              }
              currentCache = (JsonTypeCache *)currentStr;
              currentStr = *(WCHAR **)(currentStr + 0xc);
            }
          }
          if ((this->m_token).tk != tkComma) {
LAB_010b1f28:
            CheckCurrentToken(this,0x53,-0x7ff5e9eb);
            return previousCache;
          }
          Scan(this);
        }
        if (currentCache == (JsonTypeCache *)0x0) {
          this_00 = this->typeCacheList;
          Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                    (&local_b8,pcStack_98,typeWithoutProperty._4_4_);
          local_c0 = (JsonTypeCache *)0x0;
          ppJVar8 = JsUtil::
                    BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::LookupWithKey<Js::HashedCharacterBuffer<char16_t>>
                              ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)this_00,&local_b8,&local_c0);
          currentStr = (WCHAR *)*ppJVar8;
        }
        local_171 = false;
        if ((currentStr != (WCHAR *)0x0) &&
           (local_171 = false, *(DynamicType **)(currentStr + 4) == local_a8)) {
          this_01 = *(PropertyRecord **)currentStr;
          JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                    ((CharacterBuffer<char16_t> *)&typeWithProperty_1,pcStack_98,
                     typeWithoutProperty._4_4_);
          local_171 = Js::PropertyRecord::Equals
                                (this_01,(CharacterBuffer<char16_t> *)&typeWithProperty_1);
        }
        if (local_171 == false) goto LAB_010b1cbf;
        tVar3 = Scan(this);
        if (tVar3 != tkColon) {
          JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ed);
        }
        Scan(this);
        pDStack_d8 = *(DynamicType **)(currentStr + 8);
        value_2._4_4_ = Js::PropertyRecord::GetPropertyId(*(PropertyRecord **)currentStr);
        pJVar1 = previousCache;
        value_2._2_2_ = currentStr[0x10];
        currentCache = (JsonTypeCache *)currentStr;
        currentStr = *(WCHAR **)(currentStr + 0xc);
        pDVar9 = Js::DynamicType::GetTypeHandler(local_a8);
        iVar5 = Js::DynamicTypeHandler::GetSlotCapacity(pDVar9);
        pDVar9 = Js::DynamicType::GetTypeHandler(pDStack_d8);
        newCount = Js::DynamicTypeHandler::GetSlotCapacity(pDVar9);
        scriptContext = this->scriptContext;
        pDVar9 = Js::DynamicType::GetTypeHandler(pDStack_d8);
        Js::DynamicObject::EnsureSlots((DynamicObject *)pJVar1,iVar5,newCount,scriptContext,pDVar9);
        Js::DynamicObject::ReplaceType((DynamicObject *)previousCache,pDStack_d8);
        propertyRecord = (PropertyRecord *)ParseObject(this);
        Js::DynamicObject::SetSlot
                  ((DynamicObject *)previousCache,value_2._4_4_,false,(uint)(ushort)value_2._2_2_,
                   propertyRecord);
        if ((this->m_token).tk != tkComma) goto LAB_010b1f28;
        Scan(this);
      } while( true );
    }
    Scan(this);
    this_local = (JSONParser *)previousCache;
  }
  else if (tVar3 == tkSub) {
    tVar3 = Scan(this);
    if (tVar3 != tkFltCon) {
      JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ea);
    }
    dVar11 = Token::GetDouble((Token *)this);
    pJStack_20 = (JSONParser *)Js::JavascriptNumber::ToVarIntCheck(-dVar11,this->scriptContext);
    Scan(this);
    this_local = pJStack_20;
  }
  else if (tVar3 == tkLBrack) {
    pJVar6 = Js::ScriptContext::GetLibrary(this->scriptContext);
    pJStack_30 = (JSONParser *)Js::JavascriptLibrary::CreateArray(pJVar6,0);
    Scan(this);
    value._4_4_ = 0;
    while ((this->m_token).tk != tkRBrack) {
      local_40 = ParseObject(this);
      uVar10 = (ulong)value._4_4_;
      value._4_4_ = value._4_4_ + 1;
      (*(((ArrayObject *)&pJStack_30->m_token)->super_DynamicObject).super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_30,uVar10,local_40,0);
      if ((this->m_token).tk != tkComma) break;
      Scan(this);
      if ((this->m_token).tk == tkRBrack) {
        JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9e9);
      }
    }
    CheckCurrentToken(this,0x51,-0x7ff5e9ec);
    this_local = pJStack_30;
  }
  else if (tVar3 == tkFltCon) {
    dVar11 = Token::GetDouble((Token *)this);
    pJStack_20 = (JSONParser *)Js::JavascriptNumber::ToVarIntCheck(dVar11,this->scriptContext);
    Scan(this);
    this_local = pJStack_20;
  }
  else {
    if (tVar3 != tkStrCon) {
      JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ee);
    }
    arrayObj._4_4_ = JSONScanner::GetCurrentStringLen(&this->m_scanner);
    content = JSONScanner::GetCurrentString(&this->m_scanner);
    pJStack_20 = (JSONParser *)
                 Js::JavascriptString::NewCopyBuffer(content,arrayObj._4_4_,this->scriptContext);
    Scan(this);
    this_local = pJStack_20;
  }
  return this_local;
}

Assistant:

Js::Var JSONParser::ParseObject()
    {
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        Js::Var retVal;

        switch (m_token.tk)
        {

        case tkFltCon:
            retVal = Js::JavascriptNumber::ToVarIntCheck(m_token.GetDouble(), scriptContext);
            Scan();
            return retVal;

        case tkStrCon:
            {
                // will auto-null-terminate the string (as length=len+1)
                uint len = m_scanner.GetCurrentStringLen();
                retVal = Js::JavascriptString::NewCopyBuffer(m_scanner.GetCurrentString(), len, scriptContext);
                Scan();
                return retVal;
            }

        case tkTRUE:
            retVal = scriptContext->GetLibrary()->GetTrue();
            Scan();
            return retVal;

        case tkFALSE:
            retVal = scriptContext->GetLibrary()->GetFalse();
            Scan();
            return retVal;

        case tkNULL:
            retVal = scriptContext->GetLibrary()->GetNull();
            Scan();
            return retVal;

        case tkSub:  // unary minus

            if (Scan() == tkFltCon)
            {
                retVal = Js::JavascriptNumber::ToVarIntCheck(-m_token.GetDouble(), scriptContext);
                Scan();
                return retVal;
            }
            else
            {
                m_scanner.ThrowSyntaxError(JSERR_JsonBadNumber);
            }

        case tkLBrack:
            {

                Js::JavascriptArray* arrayObj = scriptContext->GetLibrary()->CreateArray(0);

                //skip '['
                Scan();

                //iterate over the array members, get JSON objects and add them in the pArrayMemberList
                uint k = 0;
                while (true)
                {
                    if(tkRBrack == m_token.tk)
                    {
                        break;
                    }
                    Js::Var value = ParseObject();
                    arrayObj->SetItem(k++, value, Js::PropertyOperation_None);

                    // if next token is not a comma consider the end of the array member list.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                    if(tkRBrack == m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }
                }
                //check and consume the ending ']'
                CheckCurrentToken(tkRBrack, JSERR_JsonNoRbrack);
                return arrayObj;

            }

        case tkLCurly:
            {

                // Parse an object, "{"name1" : ObjMember1, "name2" : ObjMember2, ...} "
                if(IsCaching())
                {
                    if(!typeCacheList)
                    {
                        typeCacheList = Anew(this->arenaAllocator, JsonTypeCacheList, this->arenaAllocator, 8);
                    }
                }

                // first, create the object
                Js::DynamicObject* object = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
                {
                    object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
                }
#endif

                //next token after '{'
                Scan();

                //if empty object "{}" return;
                if(tkRCurly == m_token.tk)
                {
                    Scan();
                    return object;
                }
                JsonTypeCache* previousCache = nullptr;
                JsonTypeCache* currentCache = nullptr;
                //parse the list of members
                while(true)
                {
                    // parse a list member:  "name" : ObjMember
                    // and add it to the object.

                    //pick "name"
                    if(tkStrCon != m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }

                    // currentStrLength = length w/o null-termination
                    WCHAR* currentStr = m_scanner.GetCurrentString();
                    uint currentStrLength = m_scanner.GetCurrentStringLen();

                    DynamicType* typeWithoutProperty = object->GetDynamicType();
                    if(IsCaching())
                    {
                        if(!previousCache)
                        {
                            // This is the first property in the list - see if we have an existing cache for it.
                            currentCache = typeCacheList->LookupWithKey(Js::HashedCharacterBuffer<WCHAR>(currentStr, currentStrLength), nullptr);
                        }
                        if(currentCache && currentCache->typeWithoutProperty == typeWithoutProperty &&
                            currentCache->propertyRecord->Equals(JsUtil::CharacterBuffer<WCHAR>(currentStr, currentStrLength)))
                        {
                            //check and consume ":"
                            if(Scan() != tkColon )
                            {
                                m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                            }
                            Scan();

                            // Cache all values from currentCache as there is a chance that ParseObject might change the cache
                            DynamicType* typeWithProperty = currentCache->typeWithProperty;
                            PropertyId propertyId = currentCache->propertyRecord->GetPropertyId();
                            PropertyIndex propertyIndex = currentCache->propertyIndex;
                            previousCache = currentCache;
                            currentCache = currentCache->next;

                            // fast path for type transition and property set
                            object->EnsureSlots(typeWithoutProperty->GetTypeHandler()->GetSlotCapacity(),
                                typeWithProperty->GetTypeHandler()->GetSlotCapacity(), scriptContext, typeWithProperty->GetTypeHandler());
                            object->ReplaceType(typeWithProperty);
                            Js::Var value = ParseObject();
                            object->SetSlot(SetSlotArguments(propertyId, propertyIndex, value));

                            // if the next token is not a comma consider the list of members done.
                            if (tkComma != m_token.tk)
                                break;
                            Scan();
                            continue;
                        }
                    }

                    // slow path
                    Js::PropertyRecord const * propertyRecord;
                    scriptContext->GetOrAddPropertyRecord(currentStr, currentStrLength, &propertyRecord);

                    //check and consume ":"
                    if(Scan() != tkColon )
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                    }
                    Scan();
                    Js::Var value = ParseObject();
                    PropertyValueInfo info;
                    object->SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, &info);

                    DynamicType* typeWithProperty = object->GetDynamicType();
                    if(IsCaching() && !propertyRecord->IsNumeric() && !info.IsNoCache() && typeWithProperty->GetIsShared() && typeWithProperty->GetTypeHandler()->IsPathTypeHandler())
                    {
                        PropertyIndex propertyIndex = info.GetPropertyIndex();

                        if(!previousCache)
                        {
                            // This is the first property in the set add it to the dictionary.
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            typeCacheList->AddNew(propertyRecord, currentCache);
                        }
                        else if(!currentCache)
                        {
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            previousCache->next = currentCache;
                        }
                        else
                        {
                            // cache miss!!
                            currentCache->Update(propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                        }
                        previousCache = currentCache;
                        currentCache = currentCache->next;
                    }

                    // if the next token is not a comma consider the list of members done.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                }

                // check  and consume the ending '}"
                CheckCurrentToken(tkRCurly, JSERR_JsonNoRcurly);
                return object;
            }

        default:
            m_scanner.ThrowSyntaxError(JSERR_JsonSyntax);
        }
    }